

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void CorUnix::CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress
               (CSynchData *pTgtObjectSynchData)

{
  ObjectDomain OVar1;
  SHMPTR shmptr;
  _WaitingThreadsListNode *local_30;
  WaitingThreadsListNode *local_28;
  WaitingThreadsListNode *local_20;
  WaitingThreadsListNode *pwtlnNode;
  bool fSharedObject;
  CSynchData *pTgtObjectSynchData_local;
  
  OVar1 = CSynchData::GetObjectDomain(pTgtObjectSynchData);
  if (OVar1 != SharedObject) {
    local_28 = CSynchData::GetWTLHeadPtr(pTgtObjectSynchData);
  }
  else {
    shmptr = CSynchData::GetWTLHeadShmPtr(pTgtObjectSynchData);
    local_28 = (WaitingThreadsListNode *)SHMPtrToPtr(shmptr);
  }
  local_20 = local_28;
  while (local_20 != (WaitingThreadsListNode *)0x0) {
    local_20->dwFlags = local_20->dwFlags & 0xfffffffb;
    if (OVar1 != SharedObject) {
      local_30 = (local_20->ptrNext).ptr;
    }
    else {
      local_30 = (_WaitingThreadsListNode *)SHMPtrToPtr((local_20->ptrNext).shrid);
    }
    local_20 = local_30;
  }
  return;
}

Assistant:

void CPalSynchronizationManager::UnmarkTWListForDelegatedObjectSignalingInProgress(
        CSynchData * pTgtObjectSynchData)
    {
        bool fSharedObject = (SharedObject == pTgtObjectSynchData->GetObjectDomain());
        WaitingThreadsListNode * pwtlnNode;

        VALIDATEOBJECT(pTgtObjectSynchData);

        pwtlnNode =  fSharedObject ?
            SharedIDToTypePointer(WaitingThreadsListNode,
                pTgtObjectSynchData->GetWTLHeadShmPtr()) :
                pTgtObjectSynchData->GetWTLHeadPtr();
        while (pwtlnNode)
        {
            VALIDATEOBJECT(pwtlnNode);

            pwtlnNode->dwFlags &= ~WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;

            pwtlnNode = fSharedObject ?
                SharedIDToTypePointer(WaitingThreadsListNode,
                    pwtlnNode->ptrNext.shrid) :
                    pwtlnNode->ptrNext.ptr;
        }
    }